

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Memory.h
# Opt level: O1

int __thiscall
Eigen::internal::SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
          (SparseLUImpl<double,int> *this,Matrix<int,__1,_1,_0,__1,_1> *vec,int *length,int nbElts,
          int keep_prev,int *num_expansions)

{
  size_t __size;
  int *piVar1;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Index size;
  void *local_40;
  
  iVar7 = *length;
  iVar4 = iVar7;
  if ((keep_prev == 0) && (*num_expansions != 0)) {
    iVar4 = iVar7 + 1;
    if (iVar7 + 1 <= (int)((float)iVar7 * 1.5)) {
      iVar4 = (int)((float)iVar7 * 1.5);
    }
  }
  uVar9 = (ulong)(uint)nbElts;
  if (nbElts < 1) {
    local_40 = (void *)0x0;
    iVar7 = 0;
  }
  else {
    if ((vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
        (long)uVar9) goto LAB_00151823;
    piVar1 = (vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    __size = uVar9 * 4;
    local_40 = malloc(__size);
    if (local_40 == (void *)0x0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = std::streambuf::xsgetn;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    if (3 < (uint)nbElts) {
      memcpy(local_40,piVar1,(ulong)(nbElts & 0x7ffffffcU) * 4);
    }
    iVar7 = nbElts;
    if ((nbElts & 0x7ffffffcU) != nbElts) {
      memcpy((void *)((long)local_40 + (__size & 0x1fffffff0)),
             (void *)((long)piVar1 + (__size & 0x1fffffff0)),__size & 0x20000000c);
    }
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,(long)iVar4);
  if (0 < nbElts) {
    if ((vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
        (long)uVar9) {
LAB_00151823:
      __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                    ,0x8d,
                    "Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<int, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    if (iVar7 != nbElts) {
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                    ,0x1f2,
                    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<int, -1, 1>]"
                   );
    }
    piVar1 = (vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar8 = uVar9;
    if ((((ulong)piVar1 & 3) == 0) &&
       (uVar8 = (ulong)(-((uint)((ulong)piVar1 >> 2) & 0x3fffffff) & 3), uVar9 <= uVar8)) {
      uVar8 = uVar9;
    }
    uVar5 = uVar9 - uVar8;
    uVar6 = uVar5 + 3;
    if (-1 < (long)uVar5) {
      uVar6 = uVar5;
    }
    if (uVar8 != 0) {
      memcpy(piVar1,local_40,uVar8 * 4);
    }
    lVar10 = (uVar6 & 0xfffffffffffffffc) + uVar8;
    if (3 < (long)uVar5) {
      lVar2 = uVar8 + 4;
      if ((long)(uVar8 + 4) < lVar10) {
        lVar2 = lVar10;
      }
      memcpy(piVar1 + uVar8,(void *)((long)local_40 + uVar8 * 4),
             (~uVar8 + lVar2 & 0xfffffffffffffffc) * 4 + 0x10);
    }
    if (lVar10 < (long)uVar9) {
      memcpy(piVar1 + ((long)uVar6 >> 2) * 4 + uVar8,
             (void *)(uVar8 * 4 + ((long)uVar6 >> 2) * 0x10 + (long)local_40),(uVar9 - lVar10) * 4);
    }
  }
  *length = iVar4;
  if (*num_expansions != 0) {
    *num_expansions = *num_expansions + 1;
  }
  free(local_40);
  return 0;
}

Assistant:

Index  SparseLUImpl<Scalar,Index>::expand(VectorType& vec, Index& length, Index nbElts, Index keep_prev, Index& num_expansions) 
{
  
  float alpha = 1.5; // Ratio of the memory increase 
  Index new_len; // New size of the allocated memory
  
  if(num_expansions == 0 || keep_prev) 
    new_len = length ; // First time allocate requested
  else 
    new_len = (std::max)(length+1,Index(alpha * length));
  
  VectorType old_vec; // Temporary vector to hold the previous values   
  if (nbElts > 0 )
    old_vec = vec.segment(0,nbElts); 
  
  //Allocate or expand the current vector
#ifdef EIGEN_EXCEPTIONS
  try
#endif
  {
    vec.resize(new_len); 
  }
#ifdef EIGEN_EXCEPTIONS
  catch(std::bad_alloc& )
#else
  if(!vec.size())
#endif
  {
    if (!num_expansions)
    {
      // First time to allocate from LUMemInit()
      // Let LUMemInit() deals with it.
      return -1;
    }
    if (keep_prev)
    {
      // In this case, the memory length should not not be reduced
      return new_len;
    }
    else 
    {
      // Reduce the size and increase again 
      Index tries = 0; // Number of attempts
      do 
      {
        alpha = (alpha + 1)/2;
        new_len = (std::max)(length+1,Index(alpha * length));
#ifdef EIGEN_EXCEPTIONS
        try
#endif
        {
          vec.resize(new_len); 
        }
#ifdef EIGEN_EXCEPTIONS
        catch(std::bad_alloc& )
#else
        if (!vec.size())
#endif
        {
          tries += 1; 
          if ( tries > 10) return new_len; 
        }
      } while (!vec.size());
    }
  }
  //Copy the previous values to the newly allocated space 
  if (nbElts > 0)
    vec.segment(0, nbElts) = old_vec;   
   
  
  length  = new_len;
  if(num_expansions) ++num_expansions;
  return 0; 
}